

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

char * __thiscall
CVmImageFileExt::alloc_mem(CVmImageFileExt *this,size_t siz,ulong remaining_in_page)

{
  CVmImageFileExt_blk *pCVar1;
  char *pcVar2;
  CVmImageFileExt_blk *pCVar3;
  CVmImageFileExt_blk *pCVar4;
  CVmImageFileExt_blk **ppCVar5;
  size_t __size;
  
  if (siz < 0x1fbe) {
    pCVar1 = this->mem_head_;
    if ((pCVar1 == (CVmImageFileExt_blk *)0x0) || (pCVar1->rem_ < siz)) {
      __size = 65000;
      if (remaining_in_page < 65000) {
        __size = remaining_in_page;
      }
      pCVar3 = (CVmImageFileExt_blk *)operator_new(0x28);
      pcVar2 = (char *)malloc(__size);
      pCVar3->block_ptr_ = pcVar2;
      pCVar3->rem_ = __size;
      pCVar3->free_ptr_ = pcVar2;
      pCVar3->nxt_ = (CVmImageFileExt_blk *)0x0;
      pCVar3->prv_ = (CVmImageFileExt_blk *)0x0;
      pCVar3->nxt_ = pCVar1;
      ppCVar5 = &pCVar1->prv_;
      if (pCVar1 == (CVmImageFileExt_blk *)0x0) {
        ppCVar5 = &this->mem_tail_;
      }
      *ppCVar5 = pCVar3;
      this->mem_head_ = pCVar3;
    }
    pCVar1 = this->mem_head_;
  }
  else {
    pCVar1 = (CVmImageFileExt_blk *)operator_new(0x28);
    pcVar2 = (char *)malloc(siz);
    pCVar1->block_ptr_ = pcVar2;
    pCVar1->rem_ = siz;
    pCVar1->free_ptr_ = pcVar2;
    pCVar1->nxt_ = (CVmImageFileExt_blk *)0x0;
    pCVar1->prv_ = (CVmImageFileExt_blk *)0x0;
    pCVar3 = this->mem_tail_;
    pCVar1->prv_ = pCVar3;
    pCVar4 = (CVmImageFileExt_blk *)&this->mem_head_;
    if (pCVar3 != (CVmImageFileExt_blk *)0x0) {
      pCVar4 = pCVar3;
    }
    pCVar4->nxt_ = pCVar1;
    this->mem_tail_ = pCVar1;
  }
  if (pCVar1->rem_ < siz) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = pCVar1->free_ptr_;
    pCVar1->free_ptr_ = pcVar2 + siz;
    pCVar1->rem_ = pCVar1->rem_ - siz;
  }
  return pcVar2;
}

Assistant:

char *CVmImageFileExt::alloc_mem(size_t siz, ulong remaining_in_page)
{
    /* 
     *   If the requested size is more than an eigth of our block size,
     *   give the new allocation its own block.  Our blocks are intended
     *   to reduce overhead for small blocks; large blocks not only won't
     *   create a lot of overhead as individual "malloc" allocations, but
     *   would probably leave our block underutilized by leaving a lot of
     *   it free, defeating the purpose. 
     */
    if (siz > VMIMAGE_EXT_BLK_SIZE / 8)
    {
        CVmImageFileExt_blk *new_block;

        /* it's a big request, so give it its own block */
        new_block = new CVmImageFileExt_blk(siz);

        /* 
         *   link it at the tail of the list (we don't want to suballocate
         *   anything more out of this, obviously, since we're going to
         *   consume the entire block, but we do want to keep it in our
         *   list so that we can track and eventually delete the memory) 
         */
        new_block->nxt_ = 0;
        new_block->prv_ = mem_tail_;

        /* set the forward pointer of the previous entry */
        if (mem_tail_ != 0)
            mem_tail_->nxt_ = new_block;
        else
            mem_head_ = new_block;

        /* it's the new tail */
        mem_tail_ = new_block;

        /* "suballocate" out of the new block */
        return mem_tail_->suballoc(siz);
    }
    else
    {
        /* 
         *   It's a small request, so suballocate it out of a block.
         *   First, make sure we have space in the current block; if not,
         *   allocate a new block. 
         */
        if (mem_head_ == 0 || siz > mem_head_->rem_)
        {
            CVmImageFileExt_blk *new_block;
            size_t new_block_size;
            
            /* 
             *   There's no space left in the current block - allocate a new
             *   block.  Leave space in the new block for further
             *   allocations, so we don't have to allocate lots of little
             *   blocks; however, as an upper bound, allocate only as much
             *   space as remains in the current page being read out of the
             *   image file, so that we don't leave a bunch of unused space
             *   after reading the last objects from the image.  
             */
            new_block_size = VMIMAGE_EXT_BLK_SIZE;
            if (new_block_size > remaining_in_page)
                new_block_size = (size_t)remaining_in_page;

            /* allocate the new block */
            new_block = new CVmImageFileExt_blk(new_block_size);

            /* link it in at the head of our list */
            new_block->prv_ = 0;
            new_block->nxt_ = mem_head_;

            /* set the back pointer of the next entry */
            if (mem_head_ != 0)
                mem_head_->prv_ = new_block;
            else
                mem_tail_ = new_block;

            /* it's the new head */
            mem_head_ = new_block;
        }

        /* suballocate it */
        return mem_head_->suballoc(siz);
    }
}